

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::set_sizes<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_false>_> *node,
          uint32_t shift)

{
  internal_node<int,_false> *piVar1;
  uint32_t uVar2;
  rrb_size_table<false> *prVar3;
  ulong uVar4;
  internal_node<int,_false> *piVar5;
  uint32_t uVar6;
  ref<immutable::rrb_details::rrb_size_table<false>_> table;
  ref<immutable::rrb_details::tree_node<int,_false>_> child;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_50;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_48;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_40;
  internal_node<int,_false> *local_38;
  
  piVar5 = node->ptr;
  local_48 = node;
  local_38 = (internal_node<int,_false> *)this;
  if (piVar5 != (internal_node<int,_false> *)0x0) {
    prVar3 = (rrb_size_table<false> *)malloc((ulong)piVar5->len * 4 + 0x10);
    prVar3->size = (uint32_t *)(prVar3 + 1);
    prVar3->guid = 0;
    prVar3->_ref_count = 1;
    uVar4 = 0;
    uVar6 = 0;
    local_50.ptr = prVar3;
    do {
      if (piVar5->len <= uVar4) {
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,&local_50);
        piVar1 = local_38;
        piVar5 = local_48->ptr;
        *(internal_node<int,_false> **)local_38 = piVar5;
        if (piVar5 != (internal_node<int,_false> *)0x0) {
          piVar5->_ref_count = piVar5->_ref_count + 1;
        }
        if ((local_50.ptr != (rrb_size_table<false> *)0x0) &&
           (uVar6 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar6 - 1, uVar6 == 1))
        {
          free(local_50.ptr);
        }
        return (ref<immutable::rrb_details::internal_node<int,_false>_>)piVar1;
      }
      local_40.ptr = (tree_node<int,_false> *)piVar5->child[uVar4].ptr;
      if ((internal_node<int,_false> *)local_40.ptr != (internal_node<int,_false> *)0x0) {
        ((internal_node<int,_false> *)local_40.ptr)->_ref_count =
             ((internal_node<int,_false> *)local_40.ptr)->_ref_count + 1;
      }
      uVar2 = size_sub_trie<int,false,6>(&local_40,shift - 6);
      uVar6 = uVar6 + uVar2;
      prVar3->size[uVar4] = uVar6;
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_40);
      uVar4 = uVar4 + 1;
      piVar5 = local_48->ptr;
    } while (piVar5 != (internal_node<int,_false> *)0x0);
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
               );
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> set_sizes(ref<internal_node<T, atomic_ref_counting>>& node, uint32_t shift)
      {
      uint32_t sum = 0;
      ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(node->len);
      const uint32_t child_shift = shift - bits<N>::rrb_bits;

      for (uint32_t i = 0; i < node->len; i++)
        {
        ref<tree_node<T, atomic_ref_counting>> child = node->child[i];
        sum += size_sub_trie<T, atomic_ref_counting, N>(child, child_shift);
        table->size[i] = sum;
        }
      node->size_table = table;
      return node;
      }